

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O3

char * Dau_ParseFormulaEndToken(char *pForm)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = pForm + 1;
  iVar2 = 0;
  do {
    bVar1 = pcVar3[-1];
    if (bVar1 < 0x29) {
      if (bVar1 == 0x28) {
        iVar2 = iVar2 + 1;
      }
      else if (bVar1 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                      ,0x5d,"char *Dau_ParseFormulaEndToken(char *)");
      }
LAB_0052378d:
      if (iVar2 == 0) {
        return pcVar3;
      }
    }
    else {
      if (bVar1 == 0x29) {
        iVar2 = iVar2 + -1;
        goto LAB_0052378d;
      }
      if (bVar1 != 0x7e) goto LAB_0052378d;
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

char * Dau_ParseFormulaEndToken( char * pForm )
{
    int Counter = 0;
    char * pThis;
    for ( pThis = pForm; *pThis; pThis++ )
    {
        if ( *pThis == '~' )
            continue;
        if ( *pThis == '(' )
            Counter++;
        else if ( *pThis == ')' )
            Counter--;
        if ( Counter == 0 )
            return pThis + 1;
    }
    assert( 0 );
    return NULL;
}